

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void openpipe(int output_id,string *pipe,FILE **fout)

{
  int iVar1;
  FILE *pFVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)pipe);
  pFVar2 = _stdout;
  if ((iVar1 != 0) && (pFVar2 = fopen((pipe->_M_dataplus)._M_p,"wb"), pFVar2 == (FILE *)0x0)) {
    openpipe();
    pFVar2 = _stdout;
  }
  fout[output_id] = (FILE *)pFVar2;
  return;
}

Assistant:

void openpipe(int output_id, const std::string& pipe, FILE** fout)
{
	if (pipe == "-") {
		fout[output_id] = stdout;
	} else {
		FILE * f = fopen(pipe.c_str(), "wb");
		if (f != nullptr) {
			fout[output_id] = f;
		} else {
			fprintf(stderr, "FATAL: Cannot open %s for output\n",
				pipe.c_str());
			exit(EXIT_FAILURE);
		}
	}
}